

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_getrealdir(char *args)

{
  size_t sVar1;
  long lVar2;
  char *rc;
  char *args_local;
  
  rc = args;
  if (*args == '\"') {
    rc = args + 1;
    sVar1 = strlen(rc);
    rc[sVar1 - 1] = '\0';
  }
  lVar2 = PHYSFS_getRealDir(rc);
  if (lVar2 == 0) {
    printf("Not found.\n");
  }
  else {
    printf("Found at [%s].\n",lVar2);
  }
  return 1;
}

Assistant:

static int cmd_getrealdir(char *args)
{
    const char *rc;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    rc = PHYSFS_getRealDir(args);
    if (rc)
        printf("Found at [%s].\n", rc);
    else
        printf("Not found.\n");

    return 1;
}